

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

bool __thiscall
Tokenizer::comparisonShiftOrAssignment
          (Tokenizer *this,char c,TokenType typeComparison,TokenType typeComparisonEq,
          TokenType typeShift,TokenType typeAssign)

{
  char cVar1;
  char cVar2;
  int iVar3;
  Mark *pMVar4;
  long *plVar5;
  long *plVar6;
  undefined7 in_register_00000031;
  undefined8 uVar7;
  undefined4 uVar8;
  bool bVar9;
  undefined1 local_11d;
  undefined4 local_11c;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_118;
  Mark local_110;
  TokenType local_108;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  byte local_e0;
  Mark local_d8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_d0 [2];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_c0;
  long local_a0 [2];
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pMVar4 = Stream::getMark(&this->stream_);
  local_110 = *pMVar4;
  cVar1 = Stream::peek(&this->stream_);
  if (cVar1 != c) goto LAB_0015c29b;
  local_11c = (undefined4)CONCAT71(in_register_00000031,c);
  iVar3 = Stream::advance(&this->stream_);
  if (iVar3 == c) {
    iVar3 = Stream::advance(&this->stream_);
    if (iVar3 == 0x3d) {
      local_d0[0] = &local_c0;
      std::__cxx11::string::_M_construct((ulong)local_d0,'\x02');
      plVar5 = (long *)std::__cxx11::string::append((char *)local_d0);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_40 = *plVar6;
        uStack_38 = (undefined4)plVar5[3];
        uStack_34 = *(undefined4 *)((long)plVar5 + 0x1c);
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar6;
        local_50 = (long *)*plVar5;
      }
      local_48 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_100[0] = local_f0;
      local_108 = typeAssign;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_50,local_48 + (long)local_50);
      local_e0 = 0;
      local_d8 = local_110;
      (this->token_).type = local_108;
      local_118 = &(this->token_).value;
      std::operator=(&local_118,(string *)local_100,&local_11d);
      (this->token_).mark = local_d8;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_e0]._M_data)
                ((anon_class_1_0_00000001 *)&local_118,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_100);
      local_e0 = 0xff;
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      bVar9 = local_d0[0] == &local_c0;
LAB_0015c27b:
      uVar8 = local_11c;
      if (!bVar9) {
        operator_delete(local_d0[0],(long)local_c0._M_rest + 1);
      }
      Stream::advance(&this->stream_);
    }
    else {
      local_70 = local_60;
      std::__cxx11::string::_M_construct((ulong)&local_70,'\x02');
      local_100[0] = local_f0;
      local_108 = typeShift;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_70,local_68 + (long)local_70);
      uVar8 = local_11c;
      local_e0 = 0;
      local_d8 = local_110;
      (this->token_).type = local_108;
      local_d0[0] = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                     *)&(this->token_).value;
      std::operator=(local_d0,(string *)local_100,&local_118);
      (this->token_).mark = local_d8;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_e0]._M_data)
                ((anon_class_1_0_00000001 *)local_d0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_100);
      local_a0[0] = local_60[0];
      uVar7 = local_70;
      if (local_70 != local_60) {
LAB_0015c0ef:
        local_e0 = 0xff;
        operator_delete((void *)uVar7,local_a0[0] + 1);
      }
    }
  }
  else {
    cVar2 = Stream::peek(&this->stream_);
    if (cVar2 == '=') {
      local_d0[0] = &local_c0;
      std::__cxx11::string::_M_construct((ulong)local_d0,'\x01');
      plVar5 = (long *)std::__cxx11::string::append((char *)local_d0);
      plVar6 = plVar5 + 2;
      if ((long *)*plVar5 == plVar6) {
        local_80 = *plVar6;
        uStack_78 = (undefined4)plVar5[3];
        uStack_74 = *(undefined4 *)((long)plVar5 + 0x1c);
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar5;
      }
      local_88 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_100[0] = local_f0;
      local_108 = typeComparisonEq;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_100,local_90,local_88 + (long)local_90);
      local_e0 = 0;
      local_d8 = local_110;
      (this->token_).type = local_108;
      local_118 = &(this->token_).value;
      std::operator=(&local_118,(string *)local_100,&local_11d);
      (this->token_).mark = local_d8;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_e0]._M_data)
                ((anon_class_1_0_00000001 *)&local_118,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_100);
      local_e0 = 0xff;
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      bVar9 = local_d0[0] == &local_c0;
      goto LAB_0015c27b;
    }
    local_c0._16_8_ = local_a0;
    std::__cxx11::string::_M_construct((long)&local_c0 + 0x10,'\x01');
    local_100[0] = local_f0;
    local_108 = typeComparison;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_c0._16_8_,local_c0._24_8_ + local_c0._16_8_);
    uVar8 = local_11c;
    local_e0 = 0;
    local_d8 = local_110;
    (this->token_).type = local_108;
    local_d0[0] = (_Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                   *)&(this->token_).value;
    std::operator=(local_d0,(string *)local_100,&local_118);
    (this->token_).mark = local_d8;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_e0]._M_data)
              ((anon_class_1_0_00000001 *)local_d0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_100);
    uVar7 = local_c0._16_8_;
    if ((long *)local_c0._16_8_ != local_a0) goto LAB_0015c0ef;
  }
  c = (char)uVar8;
LAB_0015c29b:
  return cVar1 == c;
}

Assistant:

bool Tokenizer::comparisonShiftOrAssignment(char c, TokenType typeComparison, 
    TokenType typeComparisonEq, TokenType typeShift, TokenType typeAssign)
{
  const Mark mark = stream_.getMark();
  if(stream_.peek() == c)
  {
    if(stream_.advance() == c)
    {
      if(stream_.advance() == '=')
      {
        token_ = Token{typeAssign, std::string(2, c) + "=", mark};
        stream_.advance();
      }
      else
        token_ = Token{typeShift, std::string(2, c), mark};
    }
    else if(stream_.peek() == '=')
    {
      token_ = Token{typeComparisonEq, std::string(1, c) + "=", mark};
      stream_.advance();
    }
    else
      token_ = Token{typeComparison, std::string(1, c), mark};
  }
  else
    return false;

  return true;
}